

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_link(void)

{
  ssize_t sVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  uv_buf_t uVar7;
  int64_t eval_b;
  int64_t eval_a;
  uv_fs_t req;
  
  unlink("test_file");
  unlink("test_file_link");
  unlink("test_file_link2");
  loop = uv_default_loop();
  iVar2 = uv_fs_open((uv_loop_t *)0x0,&req,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  sVar1 = req.result;
  uVar7.len = iov.len;
  uVar7.base = iov.base;
  eval_a = (int64_t)iVar2;
  eval_b = 0;
  if (eval_a == 0) {
    eval_a = req.result;
    eval_b = 0;
    if (req.result < 0) {
      pcVar5 = ">=";
      pcVar6 = "0";
      pcVar4 = "req.result";
      uVar3 = 0x822;
      iov = uVar7;
    }
    else {
      uv_fs_req_cleanup(&req);
      iov = uv_buf_init(test_buf,0xd);
      iVar2 = uv_fs_write((uv_loop_t *)0x0,&req,(uv_os_fd_t)sVar1,&iov,1,-1,(uv_fs_cb)0x0);
      eval_a = (int64_t)iVar2;
      eval_b = 0xd;
      if (eval_a == 0xd) {
        eval_a = req.result;
        eval_b = 0xd;
        if (req.result == 0xd) {
          uv_fs_req_cleanup(&req);
          iVar2 = uv_fs_close((uv_loop_t *)0x0,&req,(uv_os_fd_t)sVar1,(uv_fs_cb)0x0);
          if (iVar2 == 0) {
            if (req.result == 0) {
              uv_fs_req_cleanup(&req);
              iVar2 = uv_fs_link((uv_loop_t *)0x0,&req,"test_file","test_file_link",(uv_fs_cb)0x0);
              eval_a = (int64_t)iVar2;
              eval_b = 0;
              if (eval_a == 0) {
                eval_a = req.result;
                eval_b = 0;
                if (req.result == 0) {
                  uv_fs_req_cleanup(&req);
                  iVar2 = uv_fs_open((uv_loop_t *)0x0,&req,"test_file_link",2,0,(uv_fs_cb)0x0);
                  sVar1 = req.result;
                  eval_a = (int64_t)iVar2;
                  eval_b = 0;
                  if (eval_a == 0) {
                    eval_a = req.result;
                    eval_b = 0;
                    if (req.result < 0) {
                      pcVar5 = ">=";
                      pcVar6 = "0";
                      pcVar4 = "req.result";
                      uVar3 = 0x83a;
                    }
                    else {
                      uv_fs_req_cleanup(&req);
                      buf[0x10] = '\0';
                      buf[0x11] = '\0';
                      buf[0x12] = '\0';
                      buf[0x13] = '\0';
                      buf[0x14] = '\0';
                      buf[0x15] = '\0';
                      buf[0x16] = '\0';
                      buf[0x17] = '\0';
                      buf[0x18] = '\0';
                      buf[0x19] = '\0';
                      buf[0x1a] = '\0';
                      buf[0x1b] = '\0';
                      buf[0x1c] = '\0';
                      buf[0x1d] = '\0';
                      buf[0x1e] = '\0';
                      buf[0x1f] = '\0';
                      buf[0] = '\0';
                      buf[1] = '\0';
                      buf[2] = '\0';
                      buf[3] = '\0';
                      buf[4] = '\0';
                      buf[5] = '\0';
                      buf[6] = '\0';
                      buf[7] = '\0';
                      buf[8] = '\0';
                      buf[9] = '\0';
                      buf[10] = '\0';
                      buf[0xb] = '\0';
                      buf[0xc] = '\0';
                      buf[0xd] = '\0';
                      buf[0xe] = '\0';
                      buf[0xf] = '\0';
                      uVar7 = uv_buf_init(buf,0x20);
                      iov = uVar7;
                      iVar2 = uv_fs_read((uv_loop_t *)0x0,&req,(uv_os_fd_t)sVar1,&iov,1,0,
                                         (uv_fs_cb)0x0);
                      eval_a = (int64_t)iVar2;
                      eval_b = 0;
                      if (eval_a < 0) {
                        pcVar5 = ">=";
                        pcVar6 = "0";
                        pcVar4 = "r";
                        uVar3 = 0x841;
                      }
                      else {
                        eval_a = req.result;
                        eval_b = 0;
                        if (req.result < 0) {
                          pcVar5 = ">=";
                          pcVar6 = "0";
                          pcVar4 = "req.result";
                          uVar3 = 0x842;
                        }
                        else {
                          iVar2 = strcmp(buf,test_buf);
                          eval_a = (int64_t)iVar2;
                          eval_b = 0;
                          if (eval_a == 0) {
                            iVar2 = uv_fs_close((uv_loop_t *)0x0,&req,(uv_os_fd_t)sVar1,
                                                (uv_fs_cb)0x0);
                            if (iVar2 == 0) {
                              if (req.result == 0) {
                                uv_fs_req_cleanup(&req);
                                iVar2 = uv_fs_link(loop,&req,"test_file","test_file_link2",link_cb);
                                eval_a = (int64_t)iVar2;
                                eval_b = 0;
                                if (eval_a == 0) {
                                  uv_run(loop,UV_RUN_DEFAULT);
                                  eval_a = 1;
                                  eval_b = (int64_t)link_cb_count;
                                  if (eval_b == 1) {
                                    iVar2 = uv_fs_open((uv_loop_t *)0x0,&req,"test_file_link2",2,0,
                                                       (uv_fs_cb)0x0);
                                    sVar1 = req.result;
                                    eval_a = (int64_t)iVar2;
                                    eval_b = 0;
                                    if (eval_a == 0) {
                                      eval_a = req.result;
                                      eval_b = 0;
                                      if (req.result < 0) {
                                        pcVar5 = ">=";
                                        pcVar6 = "0";
                                        pcVar4 = "req.result";
                                        uVar3 = 0x853;
                                      }
                                      else {
                                        uv_fs_req_cleanup(&req);
                                        buf[0x10] = '\0';
                                        buf[0x11] = '\0';
                                        buf[0x12] = '\0';
                                        buf[0x13] = '\0';
                                        buf[0x14] = '\0';
                                        buf[0x15] = '\0';
                                        buf[0x16] = '\0';
                                        buf[0x17] = '\0';
                                        buf[0x18] = '\0';
                                        buf[0x19] = '\0';
                                        buf[0x1a] = '\0';
                                        buf[0x1b] = '\0';
                                        buf[0x1c] = '\0';
                                        buf[0x1d] = '\0';
                                        buf[0x1e] = '\0';
                                        buf[0x1f] = '\0';
                                        buf[0] = '\0';
                                        buf[1] = '\0';
                                        buf[2] = '\0';
                                        buf[3] = '\0';
                                        buf[4] = '\0';
                                        buf[5] = '\0';
                                        buf[6] = '\0';
                                        buf[7] = '\0';
                                        buf[8] = '\0';
                                        buf[9] = '\0';
                                        buf[10] = '\0';
                                        buf[0xb] = '\0';
                                        buf[0xc] = '\0';
                                        buf[0xd] = '\0';
                                        buf[0xe] = '\0';
                                        buf[0xf] = '\0';
                                        uVar7 = uv_buf_init(buf,0x20);
                                        iov = uVar7;
                                        iVar2 = uv_fs_read((uv_loop_t *)0x0,&req,(uv_os_fd_t)sVar1,
                                                           &iov,1,0,(uv_fs_cb)0x0);
                                        eval_a = (int64_t)iVar2;
                                        eval_b = 0;
                                        if (eval_a < 0) {
                                          pcVar5 = ">=";
                                          pcVar6 = "0";
                                          pcVar4 = "r";
                                          uVar3 = 0x85a;
                                        }
                                        else {
                                          eval_a = req.result;
                                          eval_b = 0;
                                          if (req.result < 0) {
                                            pcVar5 = ">=";
                                            pcVar6 = "0";
                                            pcVar4 = "req.result";
                                            uVar3 = 0x85b;
                                          }
                                          else {
                                            iVar2 = strcmp(buf,test_buf);
                                            eval_a = (int64_t)iVar2;
                                            eval_b = 0;
                                            if (eval_a == 0) {
                                              iVar2 = uv_fs_close((uv_loop_t *)0x0,&req,
                                                                  (uv_os_fd_t)sVar1,(uv_fs_cb)0x0);
                                              if (iVar2 == 0) {
                                                if (req.result == 0) {
                                                  uv_fs_req_cleanup(&req);
                                                  uv_run(loop,UV_RUN_DEFAULT);
                                                  unlink("test_file");
                                                  unlink("test_file_link");
                                                  unlink("test_file_link2");
                                                  close_loop(loop);
                                                  eval_a = 0;
                                                  iVar2 = uv_loop_close(loop);
                                                  eval_b = (int64_t)iVar2;
                                                  if (eval_b == 0) {
                                                    uv_library_shutdown();
                                                    return 0;
                                                  }
                                                  pcVar5 = "==";
                                                  pcVar6 = "uv_loop_close(loop)";
                                                  pcVar4 = "0";
                                                  uVar3 = 0x86f;
                                                  goto LAB_0012de78;
                                                }
                                                pcVar4 = "req.result == 0";
                                                uVar3 = 0x861;
                                              }
                                              else {
                                                pcVar4 = "r == 0";
                                                uVar3 = 0x860;
                                              }
                                              goto LAB_0012de3a;
                                            }
                                            pcVar5 = "==";
                                            pcVar6 = "0";
                                            pcVar4 = "strcmp(buf, test_buf)";
                                            uVar3 = 0x85c;
                                          }
                                        }
                                      }
                                    }
                                    else {
                                      pcVar5 = "==";
                                      pcVar6 = "0";
                                      pcVar4 = "r";
                                      uVar3 = 0x852;
                                    }
                                  }
                                  else {
                                    pcVar5 = "==";
                                    pcVar6 = "link_cb_count";
                                    pcVar4 = "1";
                                    uVar3 = 0x84f;
                                  }
                                }
                                else {
                                  pcVar5 = "==";
                                  pcVar6 = "0";
                                  pcVar4 = "r";
                                  uVar3 = 0x84d;
                                }
                                goto LAB_0012de78;
                              }
                              pcVar4 = "req.result == 0";
                              uVar3 = 0x848;
                            }
                            else {
                              pcVar4 = "r == 0";
                              uVar3 = 0x847;
                            }
                            goto LAB_0012de3a;
                          }
                          pcVar5 = "==";
                          pcVar6 = "0";
                          pcVar4 = "strcmp(buf, test_buf)";
                          uVar3 = 0x843;
                        }
                      }
                    }
                  }
                  else {
                    pcVar5 = "==";
                    pcVar6 = "0";
                    pcVar4 = "r";
                    uVar3 = 0x839;
                  }
                }
                else {
                  pcVar5 = "==";
                  pcVar6 = "0";
                  pcVar4 = "req.result";
                  uVar3 = 0x835;
                }
              }
              else {
                pcVar5 = "==";
                pcVar6 = "0";
                pcVar4 = "r";
                uVar3 = 0x834;
              }
              goto LAB_0012de78;
            }
            pcVar4 = "req.result == 0";
            uVar3 = 0x82f;
          }
          else {
            pcVar4 = "r == 0";
            uVar3 = 0x82e;
          }
LAB_0012de3a:
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
                  ,uVar3,pcVar4);
          abort();
        }
        pcVar5 = "==";
        pcVar6 = "sizeof(test_buf)";
        pcVar4 = "req.result";
        uVar3 = 0x829;
      }
      else {
        pcVar5 = "==";
        pcVar6 = "sizeof(test_buf)";
        pcVar4 = "r";
        uVar3 = 0x828;
      }
    }
  }
  else {
    pcVar5 = "==";
    pcVar6 = "0";
    pcVar4 = "r";
    uVar3 = 0x821;
  }
LAB_0012de78:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs.c"
          ,uVar3,pcVar4,pcVar5,pcVar6,eval_a,pcVar5,eval_b);
  abort();
}

Assistant:

TEST_IMPL(fs_link) {
  int r;
  uv_fs_t req;
  uv_os_fd_t file;
  uv_os_fd_t link;

  /* Setup. */
  unlink("test_file");
  unlink("test_file_link");
  unlink("test_file_link2");

  loop = uv_default_loop();

  r = uv_fs_open(NULL, &req, "test_file", UV_FS_O_RDWR | UV_FS_O_CREAT,
      S_IWUSR | S_IRUSR, NULL);
  ASSERT_OK(r);
  ASSERT_GE(req.result, 0);
  file = (uv_os_fd_t) req.result;
  uv_fs_req_cleanup(&req);

  iov = uv_buf_init(test_buf, sizeof(test_buf));
  r = uv_fs_write(NULL, &req, file, &iov, 1, -1, NULL);
  ASSERT_EQ(r, sizeof(test_buf));
  ASSERT_EQ(req.result, sizeof(test_buf));
  uv_fs_req_cleanup(&req);

  /* Close file */
  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* sync link */
  r = uv_fs_link(NULL, &req, "test_file", "test_file_link", NULL);
  ASSERT_OK(r);
  ASSERT_OK(req.result);
  uv_fs_req_cleanup(&req);

  r = uv_fs_open(NULL, &req, "test_file_link", UV_FS_O_RDWR, 0, NULL);
  ASSERT_OK(r);
  ASSERT_GE(req.result, 0);
  link = (uv_os_fd_t) req.result;
  uv_fs_req_cleanup(&req);

  memset(buf, 0, sizeof(buf));
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &req, link, &iov, 1, 0, NULL);
  ASSERT_GE(r, 0);
  ASSERT_GE(req.result, 0);
  ASSERT_OK(strcmp(buf, test_buf));

  /* Close link */
  r = uv_fs_close(NULL, &req, link, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* async link */
  r = uv_fs_link(loop, &req, "test_file", "test_file_link2", link_cb);
  ASSERT_OK(r);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_EQ(1, link_cb_count);

  r = uv_fs_open(NULL, &req, "test_file_link2", UV_FS_O_RDWR, 0, NULL);
  ASSERT_OK(r);
  ASSERT_GE(req.result, 0);
  link = (uv_os_fd_t) req.result;
  uv_fs_req_cleanup(&req);

  memset(buf, 0, sizeof(buf));
  iov = uv_buf_init(buf, sizeof(buf));
  r = uv_fs_read(NULL, &req, link, &iov, 1, 0, NULL);
  ASSERT_GE(r, 0);
  ASSERT_GE(req.result, 0);
  ASSERT_OK(strcmp(buf, test_buf));

  /* Close link */
  r = uv_fs_close(NULL, &req, link, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /*
   * Run the loop just to check we don't have make any extraneous uv_ref()
   * calls. This should drop out immediately.
   */
  uv_run(loop, UV_RUN_DEFAULT);

  /* Cleanup. */
  unlink("test_file");
  unlink("test_file_link");
  unlink("test_file_link2");

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}